

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O3

void __thiscall
Assimp::FixInfacingNormalsProcess::Execute(FixInfacingNormalsProcess *this,aiScene *pScene)

{
  byte bVar1;
  bool bVar2;
  Logger *pLVar3;
  char *message;
  ulong uVar4;
  byte bVar5;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FixInfacingNormalsProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar4 = 0;
    bVar1 = 0;
    do {
      bVar5 = bVar1;
      bVar2 = ProcessMesh((FixInfacingNormalsProcess *)pLVar3,pScene->mMeshes[uVar4],(uint)uVar4);
      uVar4 = uVar4 + 1;
      bVar1 = bVar5 | bVar2;
    } while (uVar4 < pScene->mNumMeshes);
    if (bVar5 != 0 || bVar2) {
      message = "FixInfacingNormalsProcess finished. Found issues.";
      goto LAB_003cb09e;
    }
  }
  message = "FixInfacingNormalsProcess finished. No changes to the scene.";
LAB_003cb09e:
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,message);
  return;
}

Assistant:

void FixInfacingNormalsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess begin");

    bool bHas( false );
    for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        if (ProcessMesh(pScene->mMeshes[a], a)) {
            bHas = true;
        }
    }

    if (bHas) {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. Found issues.");
    } else {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. No changes to the scene.");
    }
}